

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void mp_bezout_into(mp_int *a_coeff_out,mp_int *b_coeff_out,mp_int *gcd_out,mp_int *a_in,
                   mp_int *b_in)

{
  uint uVar1;
  mp_int *dest;
  mp_int *dest_00;
  mp_int *src;
  mp_int *src_00;
  mp_int *r;
  mp_int *x;
  BignumInt BVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  size_t nw;
  bool bVar9;
  
  uVar8 = b_in->nw;
  if (b_in->nw < a_in->nw) {
    uVar8 = a_in->nw;
  }
  nw = uVar8 + (uVar8 == 0);
  dest = mp_make_sized(nw);
  dest_00 = mp_make_sized(nw);
  mp_copy_into(dest,a_in);
  mp_copy_into(dest_00,b_in);
  src = mp_make_sized(nw + 1);
  src_00 = mp_make_sized(nw + 1);
  r = mp_make_sized(nw);
  lVar7 = nw * 0x80;
  x = mp_make_sized(nw * 4 & 0x3fffffffffffffc);
  sVar4 = 1;
  while (bVar9 = lVar7 != 0, lVar7 = lVar7 + -1, bVar9) {
    uVar1 = mp_cmp_hs(dest_00,dest);
    uVar5 = (uint)*dest->w;
    uVar3 = uVar5 & 1;
    uVar6 = (uint)*dest_00->w & uVar3;
    uVar3 = (uVar5 ^ uVar1) & uVar6 ^ uVar3;
    mp_cond_swap(dest,dest_00,uVar3);
    mp_cond_sub_into(dest,dest,dest_00,uVar6);
    mp_rshift_fixed_into(dest,dest,1);
    mp_set_bit(x,sVar4 - 1,uVar6);
    mp_set_bit(x,sVar4,uVar3);
    sVar4 = sVar4 + 2;
  }
  if (gcd_out != (mp_int *)0x0) {
    mp_add_into_internal(gcd_out,dest,dest_00);
  }
  if (a_coeff_out != (mp_int *)0x0 || b_coeff_out != (mp_int *)0x0) {
    if (dest->nw == 0) {
      BVar2 = 0;
    }
    else {
      BVar2 = (BignumInt)((uint)*dest->w & 1);
    }
    *src->w = BVar2;
    if (dest_00->nw == 0) {
      BVar2 = 0;
    }
    else {
      BVar2 = (BignumInt)((uint)*dest_00->w & 1);
    }
    *src_00->w = BVar2;
    mp_copy_into(dest,src);
    mp_copy_into(dest_00,src_00);
    uVar5 = (uint)*dest_00->w;
    sVar4 = nw * 0x100 - 1;
    for (lVar7 = nw * -0x80; lVar7 != 0; lVar7 = lVar7 + 1) {
      uVar1 = mp_get_bit(x,sVar4 - 1);
      uVar3 = mp_get_bit(x,sVar4);
      uVar6 = (uint)*src->w & 1;
      mp_cond_add_into(src,src,dest_00,uVar6);
      mp_cond_add_into(src_00,src_00,dest,uVar6);
      mp_rshift_fixed_into(src,src,1);
      mp_cond_add_into(src_00,src_00,src,uVar1);
      mp_lshift_fixed_into(dest,dest,1);
      mp_cond_add_into(dest,dest,dest_00,uVar1);
      mp_cond_swap(dest,dest_00,uVar3);
      mp_cond_swap(src,src_00,uVar3);
      uVar5 = uVar5 ^ uVar3;
      sVar4 = sVar4 - 2;
    }
    mp_sub_into(r,dest_00,src);
    mp_select_into(src,src,r,uVar5);
    mp_sub_into(r,dest,src_00);
    mp_select_into(src_00,src_00,r,uVar5);
    if (a_coeff_out != (mp_int *)0x0) {
      mp_copy_into(a_coeff_out,src);
    }
    if (b_coeff_out != (mp_int *)0x0) {
      mp_copy_into(b_coeff_out,src_00);
    }
  }
  mp_free(dest);
  mp_free(dest_00);
  mp_free(src);
  mp_free(src_00);
  mp_free(r);
  mp_free(x);
  return;
}

Assistant:

static void mp_bezout_into(mp_int *a_coeff_out, mp_int *b_coeff_out,
                           mp_int *gcd_out, mp_int *a_in, mp_int *b_in)
{
    size_t nw = size_t_max(1, size_t_max(a_in->nw, b_in->nw));

    /* Make mutable copies of the input numbers */
    mp_int *a = mp_make_sized(nw), *b = mp_make_sized(nw);
    mp_copy_into(a, a_in);
    mp_copy_into(b, b_in);

    /* Space to build up the output coefficients, with an extra word
     * so that intermediate values can overflow off the top and still
     * right-shift back down to the correct value */
    mp_int *ac = mp_make_sized(nw + 1), *bc = mp_make_sized(nw + 1);

    /* And a general-purpose temp register */
    mp_int *tmp = mp_make_sized(nw);

    /* Space to record the sequence of reduction steps to unwind. We
     * make it a BignumInt for no particular reason except that (a)
     * mp_make_sized conveniently zeroes the allocation and mp_free
     * wipes it, and (b) this way I can use mp_dump() if I have to
     * debug this code. */
    size_t steps = 2 * nw * BIGNUM_INT_BITS;
    mp_int *record = mp_make_sized(
        (steps*2 + BIGNUM_INT_BITS - 1) / BIGNUM_INT_BITS);

    for (size_t step = 0; step < steps; step++) {
        /*
         * If a and b are both odd, we want to sort them so that a is
         * larger. But if one is even, we want to sort them so that a
         * is the even one.
         */
        unsigned swap_if_both_odd = mp_cmp_hs(b, a);
        unsigned swap_if_one_even = a->w[0] & 1;
        unsigned both_odd = a->w[0] & b->w[0] & 1;
        unsigned swap = swap_if_one_even ^ (
            (swap_if_both_odd ^ swap_if_one_even) & both_odd);

        mp_cond_swap(a, b, swap);

        /*
         * If a,b are both odd, then a is the larger number, so
         * subtract the smaller one from it.
         */
        mp_cond_sub_into(a, a, b, both_odd);

        /*
         * Now a is even, so divide it by two.
         */
        mp_rshift_fixed_into(a, a, 1);

        /*
         * Record the two 1-bit values both_odd and swap.
         */
        mp_set_bit(record, step*2, both_odd);
        mp_set_bit(record, step*2+1, swap);
    }

    /*
     * Now we expect to have reduced the two numbers to 0 and d,
     * although we don't know which way round. (But we avoid checking
     * this by assertion; sometimes we'll need to do this computation
     * without giving away that we already know the inputs were bogus.
     * So we'd prefer to just press on and return nonsense.)
     */

    if (gcd_out) {
        /*
         * At this point we can return the actual gcd. Since one of
         * a,b is it and the other is zero, the easiest way to get it
         * is to add them together.
         */
        mp_add_into(gcd_out, a, b);
    }

    /*
     * If the caller _only_ wanted the gcd, and neither Bezout
     * coefficient is even required, we can skip the entire unwind
     * stage.
     */
    if (a_coeff_out || b_coeff_out) {

        /*
         * The Bezout coefficients of a,b at this point are simply 0
         * for whichever of a,b is zero, and 1 for whichever is
         * nonzero. The nonzero number equals gcd(a,b), which by
         * assumption is odd, so we can do this by just taking the low
         * bit of each one.
         */
        ac->w[0] = mp_get_bit(a, 0);
        bc->w[0] = mp_get_bit(b, 0);

        /*
         * Overwrite a,b themselves with those same numbers. This has
         * the effect of dividing both of them by d, which will
         * arrange that during the unwind stage we generate the
         * minimal coefficients instead of a larger pair.
         */
        mp_copy_into(a, ac);
        mp_copy_into(b, bc);

        /*
         * We'll maintain the invariant as we unwind that ac * a - bc
         * * b is either +d or -d (or rather, +1/-1 after scaling by
         * d), and we'll remember which. (We _could_ keep it at +d the
         * whole time, but it would cost more work every time round
         * the loop, so it's cheaper to fix that up once at the end.)
         *
         * Initially, the result is +d if a was the nonzero value after
         * reduction, and -d if b was.
         */
        unsigned minus_d = b->w[0];

        for (size_t step = steps; step-- > 0 ;) {
            /*
             * Recover the data from the step we're unwinding.
             */
            unsigned both_odd = mp_get_bit(record, step*2);
            unsigned swap = mp_get_bit(record, step*2+1);

            /*
             * Unwind the division: if our coefficient of a is odd, we
             * adjust the coefficients by +b and +a respectively.
             */
            unsigned adjust = ac->w[0] & 1;
            mp_cond_add_into(ac, ac, b, adjust);
            mp_cond_add_into(bc, bc, a, adjust);

            /*
             * Now ac is definitely even, so we divide it by two.
             */
            mp_rshift_fixed_into(ac, ac, 1);

            /*
             * Now unwind the subtraction, if there was one, by adding
             * ac to bc.
             */
            mp_cond_add_into(bc, bc, ac, both_odd);

            /*
             * Undo the transformation of the input numbers, by
             * multiplying a by 2 and then adding b to a (the latter
             * only if both_odd).
             */
            mp_lshift_fixed_into(a, a, 1);
            mp_cond_add_into(a, a, b, both_odd);

            /*
             * Finally, undo the swap. If we do swap, this also
             * reverses the sign of the current result ac*a+bc*b.
             */
            mp_cond_swap(a, b, swap);
            mp_cond_swap(ac, bc, swap);
            minus_d ^= swap;
        }

        /*
         * Now we expect to have recovered the input a,b (or rather,
         * the versions of them divided by d). But we might find that
         * our current result is -d instead of +d, that is, we have
         * A',B' such that A'a - B'b = -d.
         *
         * In that situation, we set A = b-A' and B = a-B', giving us
         * Aa-Bb = ab - A'a - ab + B'b = +1.
         */
        mp_sub_into(tmp, b, ac);
        mp_select_into(ac, ac, tmp, minus_d);
        mp_sub_into(tmp, a, bc);
        mp_select_into(bc, bc, tmp, minus_d);

        /*
         * Now we really are done. Return the outputs.
         */
        if (a_coeff_out)
            mp_copy_into(a_coeff_out, ac);
        if (b_coeff_out)
            mp_copy_into(b_coeff_out, bc);

    }

    mp_free(a);
    mp_free(b);
    mp_free(ac);
    mp_free(bc);
    mp_free(tmp);
    mp_free(record);
}